

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Aig_Man_t * Saig_ManDupFoldConstrsFunc(Aig_Man_t *pAig,int fCompl,int fVerbose)

{
  Aig_Man_t *pAVar1;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  if (pAig->nConstrs == 0) {
    pAVar1 = Aig_ManDupDfs(pAig);
    return pAVar1;
  }
  if (pAig->nConstrs < pAig->nTruePos) {
    pAVar1 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    pcVar2 = Abc_UtilStrsav(pAig->pName);
    pAVar1->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(pAig->pSpec);
    pAVar1->pSpec = pcVar2;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar1->pConst1;
    for (iVar6 = 0; iVar6 < pAig->vCis->nSize; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(pAig->vCis,iVar6);
      pAVar4 = Aig_ObjCreateCi(pAVar1);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
    }
    for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar6);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(pAVar1,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    pAVar4 = (Aig_Obj_t *)((ulong)pAVar1->pConst1 ^ 1);
    for (iVar6 = 0; iVar6 < pAig->nTruePos; iVar6 = iVar6 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar6);
      if (pAig->nTruePos - pAig->nConstrs <= iVar6) {
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        pAVar4 = Aig_Or(pAVar1,pAVar4,(Aig_Obj_t *)((ulong)pAVar5 ^ (long)fCompl));
      }
    }
    if (0 < pAig->nRegs) {
      pAVar5 = Aig_ObjCreateCi(pAVar1);
      pAVar4 = Aig_Or(pAVar1,pAVar4,pAVar5);
    }
    for (iVar6 = 0; iVar6 < pAig->nTruePos; iVar6 = iVar6 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar6);
      if (iVar6 < pAig->nTruePos - pAig->nConstrs) {
        pAVar5 = Aig_ObjChild0Copy(pAVar5);
        pAVar5 = Aig_And(pAVar1,pAVar5,(Aig_Obj_t *)((ulong)pAVar4 ^ 1));
        Aig_ObjCreateCo(pAVar1,pAVar5);
      }
    }
    for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      Aig_ObjCreateCo(pAVar1,pAVar5);
    }
    if (0 < pAig->nRegs) {
      Aig_ObjCreateCo(pAVar1,pAVar4);
      Aig_ManSetRegNum(pAVar1,pAig->nRegs + 1);
    }
    Aig_ManCleanup(pAVar1);
    Aig_ManSeqCleanup(pAVar1);
    return pAVar1;
  }
  __assert_fail("Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigConstr2.c"
                ,0x3b5,"Aig_Man_t *Saig_ManDupFoldConstrsFunc(Aig_Man_t *, int, int)");
}

Assistant:

Aig_Man_t * Saig_ManDupFoldConstrsFunc( Aig_Man_t * pAig, int fCompl, int fVerbose )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pFlopOut, * pFlopIn, * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return Aig_ManDupDfs( pAig );
    assert( Aig_ManConstrNum(pAig) < Saig_ManPoNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );

    // OR the constraint outputs
    pMiter = Aig_ManConst0( pAigNew );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_Or( pAigNew, pMiter, Aig_NotCond( Aig_ObjChild0Copy(pObj), fCompl ) );
    }

    // create additional flop
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        pFlopOut = Aig_ObjCreateCi( pAigNew );
        pFlopIn  = Aig_Or( pAigNew, pMiter, pFlopOut );
    }
    else 
        pFlopIn = pMiter;

    // create primary output
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig)-Aig_ManConstrNum(pAig) )
            continue;
        pMiter = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_Not(pFlopIn) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }

    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );

    // create additional flop 
    if ( Saig_ManRegNum(pAig) > 0 )
    {
        Aig_ObjCreateCo( pAigNew, pFlopIn );
        Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig)+1 );
    }

    // perform cleanup
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}